

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexmetadata.cpp
# Opt level: O0

QString * __thiscall
QHexMetadata::getComment
          (QString *__return_storage_ptr__,QHexMetadata *this,qint64 line,qint64 column)

{
  bool bVar1;
  QHexMetadataLine *this_00;
  qint64 qVar2;
  QHexPosition pos;
  QString local_b0;
  QHexMetadataItem *local_98;
  QHexMetadataItem *mi;
  QHexMetadataItem *local_80;
  const_iterator local_78;
  const_iterator __end1;
  const_iterator __begin1;
  QHexMetadataLine *__range1;
  QStringList comments;
  qint64 offset;
  QHexMetadataLine *metadataline;
  qint64 column_local;
  qint64 line_local;
  QHexMetadata *this_local;
  
  qVar2 = column;
  this_00 = find(this,line);
  if (this_00 == (QHexMetadataLine *)0x0) {
    QString::QString(__return_storage_ptr__);
  }
  else {
    pos.column = qVar2;
    pos.line = column;
    comments.d.size = line;
    qVar2 = QHexUtils::positionToOffset((QHexUtils *)this->m_options,(QHexOptions *)line,pos);
    QList<QString>::QList((QList<QString> *)&__range1);
    __end1 = QList<QHexMetadataItem>::begin(this_00);
    local_78 = QList<QHexMetadataItem>::end(this_00);
    while( true ) {
      local_80 = local_78.i;
      bVar1 = QList<QHexMetadataItem>::const_iterator::operator!=(&__end1,local_78);
      if (!bVar1) break;
      local_98 = QList<QHexMetadataItem>::const_iterator::operator*(&__end1);
      if (((local_98->begin <= qVar2) && (qVar2 <= local_98->end)) &&
         (bVar1 = QString::isEmpty(&local_98->comment), !bVar1)) {
        QList<QString>::push_back((QList<QString> *)&__range1,&local_98->comment);
      }
      QList<QHexMetadataItem>::const_iterator::operator++(&__end1);
    }
    QString::QString(&local_b0,"\n");
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)&__range1,&local_b0);
    QString::~QString(&local_b0);
    QList<QString>::~QList((QList<QString> *)&__range1);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QHexMetadata::getComment(qint64 line, qint64 column) const {
    auto* metadataline = this->find(line);
    if(!metadataline)
        return QString();

    auto offset = QHexUtils::positionToOffset(m_options, {line, column});
    QStringList comments;

    for(auto& mi : *metadataline) {
        if((offset < mi.begin || offset > mi.end) || mi.comment.isEmpty())
            continue;
        comments.push_back(mi.comment);
    }

    return comments.join("\n");
}